

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

void __thiscall
ByteCodeGenerator::EmitPropTypeof
          (ByteCodeGenerator *this,RegSlot lhsLocation,Symbol *sym,IdentPtr pid,FuncInfo *funcInfo)

{
  Scope *symScope;
  code *pcVar1;
  ByteCodeGenerator *pBVar2;
  FuncInfo *this_00;
  bool bVar3;
  OpCode op;
  PropertyId PVar4;
  uint uVar5;
  RegSlot RVar6;
  ByteCodeLabel labelID;
  Scope **ppSVar7;
  undefined4 *puVar8;
  Scope *scope;
  Type *pTVar9;
  FuncInfo *this_01;
  uint32 slotId;
  int i;
  int index;
  ByteCodeWriter *this_02;
  undefined1 local_a8 [8];
  List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  recList;
  undefined1 local_6c [8];
  DynamicLoadRecord rec;
  DynamicLoadKind local_58;
  PropertyId local_50;
  char local_4b;
  ProfileId local_4a;
  PropertyId envIndex;
  RegSlot local_3c;
  FuncInfo *local_38;
  
  local_50 = -1;
  ppSVar7 = &sym->scope;
  if (sym == (Symbol *)0x0) {
    ppSVar7 = &this->globalScope;
  }
  symScope = *ppSVar7;
  recList._40_8_ = pid;
  _envIndex = this;
  local_3c = lhsLocation;
  if (symScope == (Scope *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1589,"(symScope)","symScope");
    if (!bVar3) goto LAB_0081959a;
    *puVar8 = 0;
  }
  pBVar2 = _envIndex;
  if ((sym != (Symbol *)0x0) && ((sym->field_0x43 & 0x40) != 0)) {
    RVar6 = FuncInfo::AcquireTmpRegister(funcInfo);
    pBVar2 = _envIndex;
    EmitModuleExportAccess(_envIndex,sym,LdModuleSlot,RVar6,funcInfo);
    Js::ByteCodeWriter::Reg2(&pBVar2->m_writer,Typeof,local_3c,RVar6);
    FuncInfo::ReleaseTmpRegister(funcInfo,RVar6);
    return;
  }
  recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>._16_8_ =
       _envIndex->alloc;
  recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
  _vptr_ReadOnlyList = (_func_int **)0x0;
  recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.buffer.
  _0_4_ = 0;
  local_a8 = (undefined1  [8])&PTR_IsReadOnly_014f2c30;
  recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.alloc =
       (Type)0x400000000;
  rec._4_8_ = sym;
  puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  this_02 = &pBVar2->m_writer;
  local_58 = ~Invalid;
  scope = (Scope *)0x0;
  local_38 = funcInfo;
  while( true ) {
    scope = FindScopeForSym(_envIndex,symScope,scope,&local_50,funcInfo);
    if (scope == _envIndex->globalScope) {
      local_58 = ~Env;
    }
    else if (local_50 == -1) {
      if (scope->func != funcInfo) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x159f,"(funcInfo == scope->GetFunc())","funcInfo == scope->GetFunc()");
        if (!bVar3) goto LAB_0081959a;
        *puVar8 = 0;
      }
      local_58 = scope->location;
    }
    if (scope == symScope) break;
    if ((scope == (Scope *)0x0) || ((scope->field_0x44 & 1) == 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar8 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x15a9,"(scope && scope->GetIsDynamic())","scope && scope->GetIsDynamic()"
                        );
      if (!bVar3) goto LAB_0081959a;
      *puVar8 = 0;
    }
    if ((scope->field_0x44 & 2) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar8 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x15aa,"(scope->GetIsObject())","scope->GetIsObject()");
      if (!bVar3) goto LAB_0081959a;
      *puVar8 = 0;
    }
    DynamicLoadRecord::DynamicLoadRecord((DynamicLoadRecord *)local_6c);
    local_6c._4_4_ = Js::ByteCodeWriter::DefineLabel(this_02);
    if (rec._4_8_ == 0) {
      PVar4 = *(PropertyId *)(recList._40_8_ + 0x1c);
    }
    else {
      PVar4 = Symbol::EnsurePosition((Symbol *)rec._4_8_,_envIndex);
    }
    uVar5 = FuncInfo::FindOrAddReferencedPropertyId(funcInfo,PVar4);
    PVar4 = local_50;
    if (scope->scopeType == ScopeType_With) {
      if (local_50 == -1) {
        Js::ByteCodeWriter::BrProperty(this_02,BrOnHasProperty,local_6c._4_4_,local_58,uVar5);
        local_6c._0_4_ = LocalWith;
        goto LAB_00818f61;
      }
      Js::ByteCodeWriter::BrEnvProperty
                (this_02,BrOnHasEnvProperty,local_6c._4_4_,uVar5,local_50 + 1);
      local_6c._0_4_ = EnvWith;
LAB_00818f17:
      rec.kind = PVar4 + Local;
    }
    else {
      if (local_50 != -1) {
        Js::ByteCodeWriter::BrEnvProperty
                  (this_02,BrOnHasLocalEnvProperty,local_6c._4_4_,uVar5,local_50 + 1);
        local_6c._0_4_ = Env;
        goto LAB_00818f17;
      }
      Js::ByteCodeWriter::BrLocalProperty(this_02,BrOnHasLocalProperty,local_6c._4_4_,uVar5);
      local_6c._0_4_ = Local;
LAB_00818f61:
      rec.kind = local_58;
    }
    funcInfo = local_38;
    JsUtil::
    List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
    EnsureArray((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 *)local_a8,0);
    *(DynamicLoadKind *)
     ((long)recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
            _vptr_ReadOnlyList +
     (long)(int)recList.
                super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
                buffer * 0xc + 8) = rec.kind;
    *(ulong *)((long)recList.
                     super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
                     _vptr_ReadOnlyList +
              (long)(int)recList.
                         super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>
                         .buffer * 0xc) = CONCAT44(local_6c._4_4_,local_6c._0_4_);
    recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.buffer.
    _0_4_ = (int)recList.
                 super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
                 buffer + 1;
  }
  if (rec._4_8_ == 0) {
LAB_00819123:
    PVar4 = *(PropertyId *)(recList._40_8_ + 0x1c);
LAB_0081912a:
    if ((_envIndex->flags >> 10 & 1) == 0) {
      if ((_envIndex->flags & 4) == 0) {
        EmitTypeOfFld(_envIndex,funcInfo,PVar4,local_3c,0xfffffffd,LdRootFldForTypeOf,false);
        goto LAB_008191b4;
      }
LAB_00819187:
      RVar6 = FuncInfo::GetEnvRegister(funcInfo);
    }
    else {
      if ((((funcInfo->byteCodeFunction->super_FunctionProxy).field_0x46 & 1) == 0) ||
         (bVar3 = FuncInfo::IsGlobalFunction(funcInfo), funcInfo = local_38, !bVar3))
      goto LAB_00819187;
      RVar6 = local_38->frameDisplayRegister;
    }
    EmitTypeOfFld(_envIndex,local_38,PVar4,local_3c,RVar6,ScopedLdFldForTypeOf,false);
  }
  else {
    if (((*(byte *)(rec._4_8_ + 0x42) & 1) == 0) || (scope->func != funcInfo)) {
      if (rec._4_8_ == 0) goto LAB_00819123;
      if ((*(byte *)(rec._4_8_ + 0x42) & 8) != 0) {
        if (rec._4_8_ == 0) goto LAB_00819123;
        PVar4 = Symbol::EnsurePosition((Symbol *)rec._4_8_,_envIndex);
        funcInfo = local_38;
        goto LAB_0081912a;
      }
      bVar3 = Symbol::IsInSlot((Symbol *)rec._4_8_,_envIndex,funcInfo,false);
      this_00 = local_38;
      if (!bVar3 && local_50 == -1) {
        Js::ByteCodeWriter::Reg2(this_02,Typeof,local_3c,*(RegSlot *)(rec._4_8_ + 0x2c));
        goto LAB_008191b4;
      }
      PVar4 = Symbol::EnsureScopeSlot((Symbol *)rec._4_8_,_envIndex,local_38);
      local_4a = FuncInfo::FindOrAddSlotProfileId(this_00,scope,PVar4);
      this_01 = this_00;
      RVar6 = FuncInfo::AcquireTmpRegister(this_00);
      local_4b = NeedCheckBlockVar((ByteCodeGenerator *)this_01,(Symbol *)rec._4_8_,scope,this_00);
      op = GetLdSlotOp((ByteCodeGenerator *)this_01,scope,local_50,local_58,this_00);
      slotId = PVar4 + (~*(uint *)(*(long *)(rec._4_8_ + 0x20) + 0x44) & 2);
      if (local_50 == -1) {
        if ((local_58 == ~Invalid) ||
           ((local_58 != local_38->frameSlotsRegister && (local_58 != local_38->frameObjRegister))))
        {
          uVar5 = scope->innerScopeIndex;
          if (uVar5 != 0xffffffff) goto LAB_0081906d;
          if ((scope->field_0x44 & 2) == 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar8 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                               ,0x1614,"(scope->GetIsObject())","scope->GetIsObject()");
            if (!bVar3) {
LAB_0081959a:
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            *puVar8 = 0;
          }
          Js::ByteCodeWriter::Slot(this_02,op,RVar6,local_58,slotId,local_4a);
        }
        else {
          Js::ByteCodeWriter::SlotI1(this_02,op,RVar6,slotId,local_4a);
        }
      }
      else {
        uVar5 = local_50 + 1;
LAB_0081906d:
        Js::ByteCodeWriter::SlotI2(this_02,op,RVar6,uVar5,slotId,local_4a);
      }
      if (local_4b != '\0') {
        Js::ByteCodeWriter::Reg1(this_02,ChkUndecl,RVar6);
      }
      Js::ByteCodeWriter::Reg2(this_02,Typeof,local_3c,RVar6);
      FuncInfo::ReleaseTmpRegister(local_38,RVar6);
      goto LAB_008191b4;
    }
    bVar3 = Symbol::IsInSlot((Symbol *)rec._4_8_,_envIndex,funcInfo,false);
    if (bVar3) {
      PVar4 = Symbol::EnsureScopeSlot((Symbol *)rec._4_8_,_envIndex,local_38);
      FuncInfo::FindOrAddSlotProfileId(local_38,scope,PVar4);
    }
    EmitUseBeforeDeclarationRuntimeError(_envIndex,local_3c);
  }
LAB_008191b4:
  if ((int)recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
           buffer == 0) goto LAB_00819413;
  labelID = Js::ByteCodeWriter::DefineLabel(this_02);
  Js::ByteCodeWriter::Br(this_02,labelID);
  index = 0;
  puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
LAB_008191ed:
  if (rec._4_8_ == 0) {
    PVar4 = *(PropertyId *)(recList._40_8_ + 0x1c);
  }
  else {
    PVar4 = Symbol::EnsurePosition((Symbol *)rec._4_8_,_envIndex);
  }
  pTVar9 = JsUtil::
           List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
           ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                   *)local_a8,index);
  Js::ByteCodeWriter::MarkLabel(this_02,pTVar9->label);
  pTVar9 = JsUtil::
           List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
           ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                   *)local_a8,index);
  switch(pTVar9->kind) {
  case Local:
    pTVar9 = JsUtil::
             List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                     *)local_a8,index);
    EmitTypeOfFld(_envIndex,local_38,PVar4,local_3c,(pTVar9->field_2).instance,LdLocalFld,true);
    goto LAB_008193e8;
  case Env:
    RVar6 = FuncInfo::AcquireTmpRegister(local_38);
    pTVar9 = JsUtil::
             List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                     *)local_a8,index);
    Js::ByteCodeWriter::SlotI1(this_02,LdEnvObj,RVar6,(pTVar9->field_2).index);
    EmitTypeOfFld(_envIndex,local_38,PVar4,local_3c,RVar6,LdFldForTypeOf,true);
    break;
  case LocalWith:
    RVar6 = FuncInfo::AcquireTmpRegister(local_38);
    pTVar9 = JsUtil::
             List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                     *)local_a8,index);
    Js::ByteCodeWriter::Reg2(this_02,UnwrapWithObj,RVar6,(pTVar9->field_2).instance);
    EmitTypeOfFld(_envIndex,local_38,PVar4,local_3c,RVar6,LdFldForTypeOf,true);
    break;
  case EnvWith:
    RVar6 = FuncInfo::AcquireTmpRegister(local_38);
    pTVar9 = JsUtil::
             List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                     *)local_a8,index);
    Js::ByteCodeWriter::SlotI1(this_02,LdEnvObj,RVar6,(pTVar9->field_2).index);
    Js::ByteCodeWriter::Reg2(this_02,UnwrapWithObj,RVar6,RVar6);
    EmitTypeOfFld(_envIndex,local_38,PVar4,local_3c,RVar6,LdFldForTypeOf,true);
    break;
  default:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x164d,"((0))","(0)");
    if (bVar3) {
      *puVar8 = 0;
      goto LAB_008193e8;
    }
    goto LAB_0081959a;
  }
  FuncInfo::ReleaseTmpRegister(local_38,RVar6);
LAB_008193e8:
  if (index == (int)recList.
                    super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
                    buffer + -1) {
    Js::ByteCodeWriter::MarkLabel(this_02,labelID);
LAB_00819413:
    local_a8 = (undefined1  [8])&PTR_IsReadOnly_014f2c30;
    if (recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
        _vptr_ReadOnlyList != (_func_int **)0x0) {
      Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                 recList.
                 super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
                 _16_8_,recList.
                        super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>
                        ._vptr_ReadOnlyList,
                 (long)(int)recList.
                            super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>
                            .alloc * 0xc);
    }
    return;
  }
  Js::ByteCodeWriter::Br(this_02,labelID);
  index = index + 1;
  goto LAB_008191ed;
}

Assistant:

void ByteCodeGenerator::EmitPropTypeof(Js::RegSlot lhsLocation, Symbol *sym, IdentPtr pid, FuncInfo *funcInfo)
{
    // If sym belongs to a parent frame, delete it from the closure environment.
    // If it belongs to this func, but there's a non-local reference, get it from the heap-allocated frame.
    // (TODO: optimize this by getting the sym from its normal location if there are no non-local defs.)
    // Otherwise, just return false

    Js::RegSlot scopeLocation = Js::Constants::NoRegister;
    Js::PropertyId envIndex = -1;
    Scope *scope = nullptr;
    Scope *symScope = sym ? sym->GetScope() : this->globalScope;
    Assert(symScope);

    if (sym && sym->GetIsModuleExportStorage())
    {
        Js::RegSlot tmpLocation = funcInfo->AcquireTmpRegister();
        EmitModuleExportAccess(sym, Js::OpCode::LdModuleSlot, tmpLocation, funcInfo);
        this->m_writer.Reg2(Js::OpCode::Typeof, lhsLocation, tmpLocation);
        funcInfo->ReleaseTmpRegister(tmpLocation);
        return;
    }

    JsUtil::List<DynamicLoadRecord, ArenaAllocator> recList(this->alloc);

    for (;;)
    {
        scope = this->FindScopeForSym(symScope, scope, &envIndex, funcInfo);
        if (scope == this->globalScope)
        {
            scopeLocation = ByteCodeGenerator::RootObjectRegister;
        }
        else if (envIndex == -1)
        {
            Assert(funcInfo == scope->GetFunc());
            scopeLocation = scope->GetLocation();
        }

        if (scope == symScope)
        {
            break;
        }

        // Found a scope to which the property may have been added.
        Assert(scope && scope->GetIsDynamic());
        AssertOrFailFast(scope->GetIsObject());

        DynamicLoadRecord rec;

        rec.label = this->m_writer.DefineLabel();
        Js::PropertyId propertyId = sym ? sym->EnsurePosition(this) : pid->GetPropertyId();
        Js::PropertyIdIndexType propertyIndex = funcInfo->FindOrAddReferencedPropertyId(propertyId);

        if (scope->GetScopeType() != ScopeType_With)
        {
            if (envIndex == -1)
            {
                this->m_writer.BrLocalProperty(Js::OpCode::BrOnHasLocalProperty, rec.label, propertyIndex);
                rec.kind = DynamicLoadKind::Local;
                rec.instance = scopeLocation;
            }
            else
            {
                uint32 frameDisplayIndex = envIndex + Js::FrameDisplay::GetOffsetOfScopes() / sizeof(Js::Var);
                this->m_writer.BrEnvProperty(Js::OpCode::BrOnHasLocalEnvProperty, rec.label, propertyIndex, frameDisplayIndex);
                rec.kind = DynamicLoadKind::Env;
                rec.index = frameDisplayIndex;
            }
        }
        else
        {
            if (envIndex == -1)
            {
                this->m_writer.BrProperty(Js::OpCode::BrOnHasProperty, rec.label, scopeLocation, propertyIndex);
                rec.kind = DynamicLoadKind::LocalWith;
                rec.instance = scopeLocation;
            }
            else
            {
                uint32 frameDisplayIndex = envIndex + Js::FrameDisplay::GetOffsetOfScopes() / sizeof(Js::Var);
                this->m_writer.BrEnvProperty(Js::OpCode::BrOnHasEnvProperty, rec.label, propertyIndex, frameDisplayIndex);
                rec.kind = DynamicLoadKind::EnvWith;
                rec.index = frameDisplayIndex;
            }
        }

        recList.Add(rec);
    }

    // Arrived at the scope in which the property was defined.
    if (sym && sym->GetNeedDeclaration() && scope->GetFunc() == funcInfo)
    {
        // Ensure this symbol has a slot if it needs one.
        if (sym->IsInSlot(this, funcInfo))
        {
            Js::PropertyId slot = sym->EnsureScopeSlot(this, funcInfo);
            funcInfo->FindOrAddSlotProfileId(scope, slot);
        }

        EmitUseBeforeDeclarationRuntimeError(this, lhsLocation);
    }
    else if (sym == nullptr || sym->GetIsGlobal())
    {
        Js::PropertyId propertyId = sym ? sym->EnsurePosition(this) : pid->GetPropertyId();
        if (this->flags & fscrEval)
        {
            if (funcInfo->byteCodeFunction->GetIsStrictMode() && funcInfo->IsGlobalFunction())
            {
                this->EmitTypeOfFld(funcInfo, propertyId, lhsLocation, funcInfo->frameDisplayRegister, Js::OpCode::ScopedLdFldForTypeOf);
            }
            else
            {
                this->EmitTypeOfFld(funcInfo, propertyId, lhsLocation, funcInfo->GetEnvRegister(), Js::OpCode::ScopedLdFldForTypeOf);
            }
        }
        else if (this->flags & fscrImplicitThis)
        {
            this->EmitTypeOfFld(funcInfo, propertyId, lhsLocation, funcInfo->GetEnvRegister(), Js::OpCode::ScopedLdFldForTypeOf);
        }
        else
        {
            this->EmitTypeOfFld(funcInfo, propertyId, lhsLocation, ByteCodeGenerator::RootObjectRegister, Js::OpCode::LdRootFldForTypeOf);
        }
    }
    else if (sym->IsInSlot(this, funcInfo) || envIndex != -1)
    {
        // Make sure the property has a slot. This will bump up the size of the slot array if necessary.
        Js::PropertyId slot = sym->EnsureScopeSlot(this, funcInfo);
        Js::ProfileId profileId = funcInfo->FindOrAddSlotProfileId(scope, slot);
        Js::RegSlot tmpLocation = funcInfo->AcquireTmpRegister();
        bool chkBlockVar = NeedCheckBlockVar(sym, scope, funcInfo);
        Js::OpCode op;

        op = this->GetLdSlotOp(scope, envIndex, scopeLocation, funcInfo);
        slot = slot + (sym->GetScope()->GetIsObject() ? 0 : Js::ScopeSlots::FirstSlotIndex);

        if (envIndex != -1)
        {
            this->m_writer.SlotI2(op, tmpLocation, envIndex + Js::FrameDisplay::GetOffsetOfScopes() / sizeof(Js::Var), slot, profileId);
        }
        else if (scopeLocation != Js::Constants::NoRegister &&
            (scopeLocation == funcInfo->frameSlotsRegister || scopeLocation == funcInfo->frameObjRegister))
        {
            this->m_writer.SlotI1(op, tmpLocation, slot, profileId);
        }
        else if (scope->HasInnerScopeIndex())
        {
            this->m_writer.SlotI2(op, tmpLocation, scope->GetInnerScopeIndex(), slot, profileId);
        }
        else
        {
            AssertOrFailFast(scope->GetIsObject());
            this->m_writer.Slot(op, tmpLocation, scopeLocation, slot, profileId);
        }

        if (chkBlockVar)
        {
            this->m_writer.Reg1(Js::OpCode::ChkUndecl, tmpLocation);
        }

        this->m_writer.Reg2(Js::OpCode::Typeof, lhsLocation, tmpLocation);
        funcInfo->ReleaseTmpRegister(tmpLocation);
    }
    else
    {
        this->m_writer.Reg2(Js::OpCode::Typeof, lhsLocation, sym->GetLocation());
    }

    if (!recList.Empty())
    {
        Js::ByteCodeLabel doneLabel = this->m_writer.DefineLabel();
        this->m_writer.Br(doneLabel);

        for (int i = 0;; i++)
        {
            Js::RegSlot instLocation;
            Js::PropertyId propertyId = sym ? sym->EnsurePosition(this) : pid->GetPropertyId();

            this->m_writer.MarkLabel(recList.Item(i).label);
            switch(recList.Item(i).kind)
            {
                case DynamicLoadKind::Local:
                    this->EmitTypeOfFld(funcInfo, propertyId, lhsLocation, recList.Item(i).instance, Js::OpCode::LdLocalFld, true);
                    break;

                case DynamicLoadKind::Env:
                    instLocation = funcInfo->AcquireTmpRegister();
                    this->m_writer.SlotI1(Js::OpCode::LdEnvObj, instLocation, recList.Item(i).index);
                    this->EmitTypeOfFld(funcInfo, propertyId, lhsLocation, instLocation, Js::OpCode::LdFldForTypeOf, true);
                    funcInfo->ReleaseTmpRegister(instLocation);
                    break;

                case DynamicLoadKind::LocalWith:
                    instLocation = funcInfo->AcquireTmpRegister();
                    this->m_writer.Reg2(Js::OpCode::UnwrapWithObj, instLocation, recList.Item(i).instance);
                    this->EmitTypeOfFld(funcInfo, propertyId, lhsLocation, instLocation, Js::OpCode::LdFldForTypeOf, true);
                    funcInfo->ReleaseTmpRegister(instLocation);
                    break;

                case DynamicLoadKind::EnvWith:
                    instLocation = funcInfo->AcquireTmpRegister();
                    this->m_writer.SlotI1(Js::OpCode::LdEnvObj, instLocation, recList.Item(i).index);
                    this->m_writer.Reg2(Js::OpCode::UnwrapWithObj, instLocation, instLocation);
                    this->EmitTypeOfFld(funcInfo, propertyId, lhsLocation, instLocation, Js::OpCode::LdFldForTypeOf, true);
                    funcInfo->ReleaseTmpRegister(instLocation);
                    break;

                default:
                    AssertOrFailFast(UNREACHED);
            }

            if (i == recList.Count() - 1)
            {
                break;
            }
            this->m_writer.Br(doneLabel);
        }

        this->m_writer.MarkLabel(doneLabel);
    }
}